

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorPool::DescriptorPool
          (DescriptorPool *this,DescriptorDatabase *fallback_database,
          ErrorCollector *error_collector)

{
  Mutex *pMVar1;
  Tables *this_00;
  
  (this->field_memo_table_mutex_).mu_.super___atomic_base<long>._M_i = 0;
  std::
  make_unique<absl::lts_20250127::flat_hash_map<std::pair<void_const*,void_const*>,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,void_const*>>,std::equal_to<std::pair<void_const*,void_const*>>,std::allocator<std::pair<std::pair<void_const*,void_const*>const,std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,std::default_delete<google::protobuf::DescriptorPool::MemoBase>>>>>>
            ();
  pMVar1 = (Mutex *)operator_new(8);
  (pMVar1->mu_).super___atomic_base<long>._M_i = 0;
  this->mutex_ = pMVar1;
  this->fallback_database_ = fallback_database;
  this->default_error_collector_ = error_collector;
  this->underlay_ = (DescriptorPool *)0x0;
  (this->dispatcher_)._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_std::default_delete<absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_>_>
  .
  super__Head_base<0UL,_absl::lts_20250127::AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const>_*,_false>
  ._M_head_impl = (AnyInvocable<void_(absl::lts_20250127::FunctionRef<void_()>)_const> *)0x0;
  this_00 = (Tables *)operator_new(0x1a0);
  Tables::Tables(this_00);
  (this->tables_)._M_t.
  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
  .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>._M_head_impl = this_00;
  this->enforce_dependencies_ = true;
  (this->direct_input_files_).
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  *(size_t *)
   ((long)&(this->direct_input_files_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   8) = 0;
  this->lazily_build_dependencies_ = false;
  this->allow_unknown_ = false;
  this->enforce_weak_ = false;
  this->enforce_extension_declarations_ = kNoEnforcement;
  this->disallow_enforce_utf8_ = false;
  this->deprecated_legacy_json_field_conflicts_ = false;
  this->enforce_naming_style_ = false;
  this->build_started_ = false;
  (((HeapOrSoo *)
   ((long)&(this->direct_input_files_).
           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           .
           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
           .settings_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
           .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value +
   0x10))->heap).control = (ctrl_t *)0x447ab0;
  (this->feature_set_defaults_spec_)._M_t.
  super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
       (FeatureSetDefaults *)0x0;
  return;
}

Assistant:

DescriptorPool::DescriptorPool(DescriptorDatabase* fallback_database,
                               ErrorCollector* error_collector)
    : mutex_(new absl::Mutex),
      fallback_database_(fallback_database),
      default_error_collector_(error_collector),
      underlay_(nullptr),
      tables_(new Tables),
      enforce_dependencies_(true),
      lazily_build_dependencies_(false),
      allow_unknown_(false),
      enforce_weak_(false),
      enforce_extension_declarations_(ExtDeclEnforcementLevel::kNoEnforcement),
      disallow_enforce_utf8_(false),
      deprecated_legacy_json_field_conflicts_(false),
      enforce_naming_style_(false) {}